

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistwidget.cpp
# Opt level: O1

void __thiscall QListWidget::setCurrentRow(QListWidget *this,int row,SelectionFlags command)

{
  long lVar1;
  long lVar2;
  long *plVar3;
  long *plVar4;
  long in_FS_OFFSET;
  undefined1 local_40 [24];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QListView).super_QAbstractItemView.super_QAbstractScrollArea.
                    super_QFrame.super_QWidget.field_0x8;
  lVar2 = *(long *)(lVar1 + 800);
  if ((lVar2 == 0) || (*(int *)(lVar2 + 4) == 0)) {
    plVar4 = (long *)0x0;
  }
  else {
    plVar4 = *(long **)(lVar1 + 0x328);
  }
  plVar3 = (long *)QMetaObject::cast((QObject *)&QListModel::staticMetaObject);
  (**(code **)(*plVar3 + 0x60))(local_40,plVar3,row,0);
  (**(code **)(*plVar4 + 0x60))
            (plVar4,local_40,
             command.super_QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4>.
             super_QFlagsStorage<QItemSelectionModel::SelectionFlag>.i);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QListWidget::setCurrentRow(int row, QItemSelectionModel::SelectionFlags command)
{
    Q_D(QListWidget);
    d->selectionModel->setCurrentIndex(d->listModel()->index(row), command);
}